

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void process_pending_handles(Curl_multi *multi)

{
  undefined1 *puVar1;
  curl_llist_element *e;
  Curl_easy *data;
  
  e = (multi->pending).head;
  if (e != (curl_llist_element *)0x0) {
    data = (Curl_easy *)e->ptr;
    if (data->mstate != CURLM_STATE_CONNECT) {
      data->mstate = CURLM_STATE_CONNECT;
      Curl_init_CONNECT(data);
    }
    Curl_llist_remove(&multi->pending,e,(void *)0x0);
    Curl_expire(data,0,EXPIRE_RUN_NOW);
    puVar1 = &(data->state).field_0x4e5;
    *puVar1 = *puVar1 | 0x20;
  }
  return;
}

Assistant:

static void process_pending_handles(struct Curl_multi *multi)
{
  struct curl_llist_element *e = multi->pending.head;
  if(e) {
    struct Curl_easy *data = e->ptr;

    DEBUGASSERT(data->mstate == CURLM_STATE_CONNECT_PEND);

    multistate(data, CURLM_STATE_CONNECT);

    /* Remove this node from the list */
    Curl_llist_remove(&multi->pending, e, NULL);

    /* Make sure that the handle will be processed soonish. */
    Curl_expire(data, 0, EXPIRE_RUN_NOW);

    /* mark this as having been in the pending queue */
    data->state.previouslypending = TRUE;
  }
}